

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  string *config;
  cmGeneratorTarget *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  char *pcVar2;
  string linkFlagsConfig;
  string extraFlags;
  string linkRuleVar;
  string linkLanguage;
  allocator local_c9;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  config = &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName;
  cmGeneratorTarget::GetLinkerLanguage
            (&local_48,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  std::__cxx11::string::string((string *)&local_68,"CMAKE_",(allocator *)&local_88);
  std::__cxx11::string::append((string *)&local_68);
  std::__cxx11::string::append((char *)&local_68);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::__cxx11::string::string((string *)&local_a8,"LINK_FLAGS",(allocator *)&local_c8);
  pcVar2 = cmGeneratorTarget::GetProperty(this_00,&local_a8);
  (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
            (pcVar1,&local_88,pcVar2);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"LINK_FLAGS_",(allocator *)&local_c8);
  cmsys::SystemTools::UpperCase(&local_c8,config);
  std::__cxx11::string::append((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pcVar2 = cmGeneratorTarget::GetProperty
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget,&local_a8);
  (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
            (pcVar1,&local_88,pcVar2);
  pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::__cxx11::string::string((string *)&local_c8,"CMAKE_MODULE_LINKER_FLAGS",&local_c9);
  cmLocalGenerator::AddConfigVariableFlags((cmLocalGenerator *)pcVar1,&local_88,&local_c8,config);
  std::__cxx11::string::~string((string *)&local_c8);
  cmCommonTargetGenerator::AddModuleDefinitionFlag((cmCommonTargetGenerator *)this,&local_88);
  WriteLibraryRules(this,&local_68,&local_88,relink);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteModuleLibraryRules(bool relink)
{
  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
  std::string linkRuleVar = "CMAKE_";
  linkRuleVar += linkLanguage;
  linkRuleVar += "_CREATE_SHARED_MODULE";

  std::string extraFlags;
  this->LocalGenerator->AppendFlags(extraFlags,
                           this->GeneratorTarget->GetProperty("LINK_FLAGS"));
  std::string linkFlagsConfig = "LINK_FLAGS_";
  linkFlagsConfig += cmSystemTools::UpperCase(this->ConfigName);
  this->LocalGenerator->AppendFlags
    (extraFlags, this->GeneratorTarget->GetProperty(linkFlagsConfig));
  this->LocalGenerator->AddConfigVariableFlags
    (extraFlags, "CMAKE_MODULE_LINKER_FLAGS", this->ConfigName);
  this->AddModuleDefinitionFlag(extraFlags);

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}